

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O0

char * cmime_header_to_string(CMimeHeader_T *header)

{
  char *__ptr;
  size_t sVar1;
  size_t sVar2;
  char *local_30;
  char *ptemp;
  char *pcStack_20;
  int i;
  char *value;
  char *out;
  CMimeHeader_T *header_local;
  
  value = (char *)0x0;
  pcStack_20 = (char *)0x0;
  ptemp._4_4_ = 0;
  local_30 = (char *)0x0;
  out = (char *)header;
  if (header != (CMimeHeader_T *)0x0) {
    value = (char *)calloc(1,1);
    for (ptemp._4_4_ = 0; ptemp._4_4_ < (int)*(undefined8 *)(out + 0x10);
        ptemp._4_4_ = ptemp._4_4_ + 1) {
      pcStack_20 = cmime_header_get_value((CMimeHeader_T *)out,ptemp._4_4_);
      if ((pcStack_20 == (char *)0x0) || (sVar1 = strlen(pcStack_20), sVar1 == 0)) {
        asprintf(&local_30,"%s:",*(undefined8 *)out);
      }
      else if (*(int *)(out + 0x18) == 1) {
        asprintf(&local_30,"%s:%s",*(undefined8 *)out,pcStack_20);
      }
      else if (*pcStack_20 == ' ') {
        asprintf(&local_30,"%s:%s",*(undefined8 *)out,pcStack_20);
      }
      else {
        asprintf(&local_30,"%s: %s",*(undefined8 *)out,pcStack_20);
      }
      __ptr = value;
      sVar1 = strlen(value);
      sVar2 = strlen(local_30);
      value = (char *)realloc(__ptr,sVar1 + sVar2 + 1);
      strcat(value,local_30);
      free(local_30);
    }
    return value;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x68,"char *cmime_header_to_string(CMimeHeader_T *)");
}

Assistant:

char *cmime_header_to_string(CMimeHeader_T *header) {
    char *out = NULL;
    char *value = NULL;
    int i = 0;
    char *ptemp = NULL;
    
    assert(header);

    out = (char *)calloc(sizeof(char),sizeof(char));
    for(i = 0; i < cmime_header_get_count(header); i++) {
        value = cmime_header_get_value(header,i);
        if ((value !=NULL) && (strlen(value)>0)) {
            if (header->parsed==1) {
                asprintf(&ptemp,"%s:%s",cmime_header_get_name(header),value);
            } else {
                if (value[0] == (unsigned char)32)
                    asprintf(&ptemp,"%s:%s",cmime_header_get_name(header),value);
                else
                    asprintf(&ptemp,"%s: %s",cmime_header_get_name(header),value);
            }
        } else {
            asprintf(&ptemp,"%s:",cmime_header_get_name(header));
        }
        out = (char *)realloc(out,strlen(out) + strlen(ptemp) + 1);
        strcat(out,ptemp);
        free(ptemp);
    }
    
    return(out);
}